

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.hpp
# Opt level: O3

void viennamath::inplace_simplify<viennamath::rt_expression_interface<double>>
               (rt_expr<viennamath::rt_expression_interface<double>_> *e)

{
  int iVar1;
  rt_expression_interface<double> *prVar2;
  rt_expression_interface<double> *prVar3;
  undefined4 extraout_var;
  
  prVar3 = (e->rt_expr_)._M_ptr;
  while( true ) {
    iVar1 = (*prVar3->_vptr_rt_expression_interface[0x11])();
    if ((char)iVar1 == '\0') break;
    iVar1 = (*((e->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[0x10])();
    prVar2 = (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar1);
    prVar3 = (e->rt_expr_)._M_ptr;
    if (prVar3 != prVar2) {
      if (prVar3 != (rt_expression_interface<double> *)0x0) {
        (*prVar3->_vptr_rt_expression_interface[1])();
      }
      (e->rt_expr_)._M_ptr = prVar2;
      prVar3 = prVar2;
    }
  }
  return;
}

Assistant:

void inplace_simplify(rt_expr<InterfaceType> & e)
  {
    while (e.get()->can_simplify())
      e = e.get()->simplify();
  }